

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O3

TPZTransform<double> *
pztopology::TPZLine::TransformSideToElement(TPZTransform<double> *__return_storage_ptr__,int side)

{
  double **ppdVar1;
  TPZTransform<double> t;
  double local_1c0;
  TPZTransform<double> local_1b8;
  
  if ((uint)side < 3) {
    TPZTransform<double>::TPZTransform(&local_1b8,1,(uint)(side == 2));
    (*local_1b8.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xf])();
    (*local_1b8.fSum.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xf])();
    ppdVar1 = &local_1b8.fSum.super_TPZFMatrix<double>.fElem;
    if (side == 0) {
      local_1c0 = -1.0;
      if ((local_1b8.fSum.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
           < 1) || (local_1b8.fSum.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
    }
    else if (side == 1) {
      local_1c0 = 1.0;
      if ((local_1b8.fSum.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
           < 1) || (local_1b8.fSum.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
    }
    else {
      ppdVar1 = &local_1b8.fMult.super_TPZFMatrix<double>.fElem;
      local_1c0 = 1.0;
      if ((local_1b8.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
           < 1) || (local_1b8.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
    }
    **ppdVar1 = local_1c0;
    TPZTransform<double>::TPZTransform(__return_storage_ptr__,&local_1b8);
    TPZTransform<double>::~TPZTransform(&local_1b8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZLine::TransformSideToElement side out range\n",0x2f);
    TPZTransform<double>::TPZTransform(__return_storage_ptr__,0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<> TPZLine::TransformSideToElement(int side){
		
		if(side<0 || side>2){
			PZError << "TPZLine::TransformSideToElement side out range\n";
			return TPZTransform<>(0,0);
		}
		int sidedim = 1;
		if(side <2) sidedim = 0;
		
		TPZTransform<> t(1,sidedim);
		t.Mult().Zero();
		t.Sum().Zero();
		
		switch(side){
			case 0:
				t.Sum()(0,0) = -1.0;
				return t;
			case 1:
				t.Sum()(0,0) =  1.0;
				return t;
			case 2:
				t.Mult()(0,0) =  1.0;
				return t;
		}
		return TPZTransform<>(0,0);
	}